

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testValid_Pipeline(void)

{
  RepeatedField<long> *this;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  Pipeline *pPVar6;
  Model *pMVar7;
  Model *pMVar8;
  Model *pMVar9;
  Model *pMVar10;
  NeuralNetwork *nn;
  ostream *poVar11;
  NetworkUpdateParameters *pNVar12;
  LossLayer *pLVar13;
  CategoricalCrossEntropyLossLayer *pCVar14;
  ModelDescription *pMVar15;
  FeatureDescription *obj;
  void *pvVar16;
  FeatureType *pFVar17;
  ArrayFeatureType *pAVar18;
  long *plVar19;
  undefined8 *puVar20;
  uint uVar21;
  Arena *pAVar22;
  RepeatedPtrField<CoreML::Specification::Model> *this_00;
  Result res;
  string targetName;
  string softmaxOutputName;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  Model spec;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  TensorAttributes local_138;
  TensorAttributes local_128;
  TensorAttributes local_118;
  TensorAttributes local_108;
  Model local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_68;
  
  CoreML::Specification::Model::Model(&local_f8,(Arena *)0x0,false);
  CoreML::Result::Result((Result *)local_1a0);
  local_108.name = "A";
  local_108.dimension = 3;
  local_108._12_4_ = 0;
  local_118.name = "B";
  local_118.dimension = 1;
  local_118._12_4_ = 0;
  local_128.name = "C";
  local_128.dimension = 1;
  local_128._12_4_ = 0;
  local_138.name = "D";
  local_138.dimension = 3;
  local_138._12_4_ = 0;
  pPVar6 = buildEmptyPipelineModelWithStringOutput(&local_f8,true,&local_108,"E");
  local_f8.specificationversion_ = 4;
  this_00 = &pPVar6->models_;
  pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001e0224:
    pMVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                       ((this_00->super_RepeatedPtrFieldBase).arena_);
    pMVar7 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&this_00->super_RepeatedPtrFieldBase,pMVar7);
  }
  else {
    iVar1 = (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001e0224;
    (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar7 = (Model *)pRVar3->elements[iVar1];
  }
  pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001e025c:
    pMVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                       ((this_00->super_RepeatedPtrFieldBase).arena_);
    pMVar8 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&this_00->super_RepeatedPtrFieldBase,pMVar8);
  }
  else {
    iVar1 = (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001e025c;
    (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar8 = (Model *)pRVar3->elements[iVar1];
  }
  pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001e0294:
    pMVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                       ((this_00->super_RepeatedPtrFieldBase).arena_);
    pMVar9 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&this_00->super_RepeatedPtrFieldBase,pMVar9);
  }
  else {
    iVar1 = (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001e0294;
    (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar9 = (Model *)pRVar3->elements[iVar1];
  }
  pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001e02cc:
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pMVar10 = (Model *)google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                 (&this_00->super_RepeatedPtrFieldBase,pMVar10);
  }
  else {
    iVar1 = (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001e02cc;
    (pPVar6->models_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pMVar10 = (Model *)pRVar3->elements[iVar1];
  }
  buildBasicNeuralNetworkModel(pMVar7,false,&local_108,&local_118,1,false,false);
  buildBasicNeuralNetworkModel(pMVar8,false,&local_118,&local_128,1,false,false);
  nn = buildBasicNeuralNetworkModel(pMVar9,true,&local_128,&local_138,1,false,false);
  buildBasicNearestNeighborClassifier(pMVar10,false,&local_138,"E");
  CoreML::Model::validate((Result *)local_1c8,pMVar7);
  local_1a0 = local_1c8;
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
  }
  bVar5 = CoreML::Result::good((Result *)local_1a0);
  if (bVar5) {
    CoreML::Model::validate((Result *)local_1c8,pMVar8);
    local_1a0 = local_1c8;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
    }
    bVar5 = CoreML::Result::good((Result *)local_1a0);
    if (bVar5) {
      CoreML::Model::validate((Result *)local_1c8,pMVar9);
      local_1a0 = local_1c8;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_p != &local_1b0) {
        operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
      }
      bVar5 = CoreML::Result::good((Result *)local_1a0);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                   ,0x74);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x987);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      }
      else {
        CoreML::Model::validate((Result *)local_1c8,pMVar10);
        local_1a0 = local_1c8;
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_p != &local_1b0) {
          operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
        }
        bVar5 = CoreML::Result::good((Result *)local_1a0);
        if (bVar5) {
          CoreML::Model::validate((Result *)local_1c8,&local_f8);
          local_1a0 = local_1c8;
          std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_p != &local_1b0) {
            operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
          }
          bVar5 = CoreML::Result::good((Result *)local_1a0);
          if (!bVar5) {
            local_158[0] = local_148;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"softmax_out","");
            local_178[0] = local_168;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"cce_target","");
            addSoftmaxLayer(pMVar9,"softmax",local_138.name,(char *)local_158[0]);
            if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
              uVar4 = (nn->super_MessageLite)._internal_metadata_.ptr_;
              pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
              if ((uVar4 & 1) != 0) {
                pAVar22 = *(Arena **)pAVar22;
              }
              pNVar12 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar22);
              nn->updateparams_ = pNVar12;
            }
            pNVar12 = nn->updateparams_;
            pRVar3 = (pNVar12->losslayers_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar3 == (Rep *)0x0) {
LAB_001e0911:
              pLVar13 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::LossLayer>
                                  ((pNVar12->losslayers_).super_RepeatedPtrFieldBase.arena_);
              pLVar13 = (LossLayer *)
                        google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                  (&(pNVar12->losslayers_).super_RepeatedPtrFieldBase,pLVar13);
            }
            else {
              iVar1 = (pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar3->allocated_size <= iVar1) goto LAB_001e0911;
              (pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
              pLVar13 = (LossLayer *)pRVar3->elements[iVar1];
            }
            uVar4 = (pLVar13->super_MessageLite)._internal_metadata_.ptr_;
            puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
            if ((uVar4 & 1) != 0) {
              puVar20 = (undefined8 *)*puVar20;
            }
            google::protobuf::internal::ArenaStringPtr::
            Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                      (&pLVar13->name_,"cce_loss",puVar20);
            if (pLVar13->_oneof_case_[0] != 10) {
              CoreML::Specification::LossLayer::clear_LossLayerType(pLVar13);
              pLVar13->_oneof_case_[0] = 10;
              uVar4 = (pLVar13->super_MessageLite)._internal_metadata_.ptr_;
              pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
              if ((uVar4 & 1) != 0) {
                pAVar22 = *(Arena **)pAVar22;
              }
              pCVar14 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::CategoricalCrossEntropyLossLayer>
                                  (pAVar22);
              (pLVar13->LossLayerType_).categoricalcrossentropylosslayer_ = pCVar14;
            }
            pCVar14 = (pLVar13->LossLayerType_).categoricalcrossentropylosslayer_;
            uVar4 = (pCVar14->super_MessageLite)._internal_metadata_.ptr_;
            puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
            if ((uVar4 & 1) != 0) {
              puVar20 = (undefined8 *)*puVar20;
            }
            google::protobuf::internal::ArenaStringPtr::Set(&pCVar14->input_,local_158,puVar20);
            uVar4 = (pCVar14->super_MessageLite)._internal_metadata_.ptr_;
            puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
            if ((uVar4 & 1) != 0) {
              puVar20 = (undefined8 *)*puVar20;
            }
            google::protobuf::internal::ArenaStringPtr::Set(&pCVar14->target_,local_178,puVar20);
            if (pMVar9->description_ == (ModelDescription *)0x0) {
              uVar4 = (pMVar9->super_MessageLite)._internal_metadata_.ptr_;
              pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
              if ((uVar4 & 1) != 0) {
                pAVar22 = *(Arena **)pAVar22;
              }
              pMVar15 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::ModelDescription>(pAVar22);
              pMVar9->description_ = pMVar15;
            }
            pMVar15 = pMVar9->description_;
            pRVar3 = (pMVar15->traininginput_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar3 == (Rep *)0x0) {
LAB_001e0a24:
              obj = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                              ((pMVar15->traininginput_).super_RepeatedPtrFieldBase.arena_);
              pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                  (&(pMVar15->traininginput_).super_RepeatedPtrFieldBase,obj);
            }
            else {
              iVar1 = (pMVar15->traininginput_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar3->allocated_size <= iVar1) goto LAB_001e0a24;
              (pMVar15->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
              pvVar16 = pRVar3->elements[iVar1];
            }
            puVar20 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
            if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
              puVar20 = (undefined8 *)*puVar20;
            }
            google::protobuf::internal::ArenaStringPtr::Set
                      ((ArenaStringPtr *)((long)pvVar16 + 0x10),local_178,puVar20);
            if (*(long *)((long)pvVar16 + 0x20) == 0) {
              pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
              if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
                pAVar22 = *(Arena **)pAVar22;
              }
              pFVar17 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar22);
              *(FeatureType **)((long)pvVar16 + 0x20) = pFVar17;
            }
            pFVar17 = *(FeatureType **)((long)pvVar16 + 0x20);
            if (pFVar17->_oneof_case_[0] != 5) {
              CoreML::Specification::FeatureType::clear_Type(pFVar17);
              pFVar17->_oneof_case_[0] = 5;
              uVar4 = (pFVar17->super_MessageLite)._internal_metadata_.ptr_;
              pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
              if ((uVar4 & 1) != 0) {
                pAVar22 = *(Arena **)pAVar22;
              }
              pAVar18 = google::protobuf::Arena::
                        CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>(pAVar22);
              (pFVar17->Type_).multiarraytype_ = pAVar18;
            }
            pAVar18 = (pFVar17->Type_).multiarraytype_;
            pAVar18->datatype_ = 0x20020;
            this = &pAVar18->shape_;
            uVar21 = (pAVar18->shape_).current_size_;
            uVar2 = (pAVar18->shape_).total_size_;
            if (uVar21 == uVar2) {
              google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
            }
            plVar19 = google::protobuf::RepeatedField<long>::elements(this);
            plVar19[uVar21] = 1;
            this->current_size_ = uVar21 + 1;
            addLearningRate<CoreML::Specification::NeuralNetwork>
                      (nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
            local_68._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_68._M_impl.super__Rb_tree_header._M_header;
            local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_68._M_impl._0_8_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_68._M_impl.super__Rb_tree_header._M_header._M_left;
            addMiniBatchSize<CoreML::Specification::NeuralNetwork>
                      (nn,kSgdOptimizer,10,5,100,
                       (set<long,_std::less<long>,_std::allocator<long>_> *)&local_68);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_68);
            local_98._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_98._M_impl.super__Rb_tree_header._M_header;
            local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_98._M_impl._0_8_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_98._M_impl.super__Rb_tree_header._M_header._M_left;
            addEpochs<CoreML::Specification::NeuralNetwork>
                      (nn,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_98);
            local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_c8._M_impl.super__Rb_tree_header._M_header;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_c8._M_impl._0_8_ = 0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
            addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
                      (nn,0x7e3,0,0x7e3,
                       (set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_c8);
            CoreML::Model::validate((Result *)local_1c8,pMVar9);
            local_1a0 = local_1c8;
            std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_p != &local_1b0) {
              operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
            }
            bVar5 = CoreML::Result::good((Result *)local_1a0);
            if (!bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                         ,0x74);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x9a9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(res).good()",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11," was false, expected true.",0x1a);
              std::endl<char,std::char_traits<char>>(poVar11);
            }
            uVar21 = (uint)!bVar5;
            if (local_178[0] != local_168) {
              operator_delete(local_178[0],local_168[0] + 1);
            }
            if (local_158[0] != local_148) {
              operator_delete(local_158[0],local_148[0] + 1);
            }
            goto LAB_001e0650;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x74);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x74);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x74);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x984);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x981);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  }
  std::ostream::put((char)poVar11);
  uVar21 = 1;
  std::ostream::flush();
LAB_001e0650:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_f8);
  return uVar21;
}

Assistant:

int testValid_Pipeline() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, true, &tensorAttributesA, "E");
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    auto neuralNet = buildBasicNeuralNetworkModel(*m3, true, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, false, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to pass!
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Add target to updatable neural network model (3rd) within pipeline
    std::string softmaxOutputName = "softmax_out";
    std::string targetName = "cce_target";
    (void)addSoftmaxLayer(*m3, "softmax", tensorAttributesD.name, softmaxOutputName.c_str());

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cce_loss");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxOutputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = (*m3).mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    return 0;
}